

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::AddUtility(cmTarget *this,string *u,cmMakefile *mf)

{
  bool bVar1;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> util;
  cmMakefile *mf_local;
  string *u_local;
  cmTarget *this_local;
  
  util.Backtrace.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mf;
  std::__cxx11::string::string((string *)(local_80 + 0x10),(string *)u);
  bVar1 = util.Backtrace.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (bVar1) {
    memset(local_80,0,0x10);
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_80);
  }
  else {
    cmMakefile::GetBacktrace((cmMakefile *)local_80);
  }
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )(local_80 + 0x30),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_80 + 0x10),
             (cmListFileBacktrace *)local_80);
  if (bVar1) {
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_80);
  }
  else {
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_80);
  }
  std::__cxx11::string::~string((string *)(local_80 + 0x10));
  std::
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::insert(&this->Utilities,(value_type *)(local_80 + 0x30));
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )(local_80 + 0x30));
  return;
}

Assistant:

void cmTarget::AddUtility(std::string const& u, cmMakefile* mf)
{
  BT<std::string> util(u, mf ? mf->GetBacktrace() : cmListFileBacktrace());
  this->Utilities.insert(util);
}